

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fverb.cpp
# Opt level: O0

bool Fverb::parameter_is_logarithmic(uint index)

{
  undefined1 local_9;
  uint index_local;
  
  if (index == 2) {
    local_9 = true;
  }
  else if (index == 3) {
    local_9 = true;
  }
  else if (index == 8) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool Fverb::parameter_is_logarithmic(unsigned index) noexcept
{
    switch (index) {

    case 2:
        return true;

    case 3:
        return true;

    case 8:
        return true;

    default:
        return false;
    }
}